

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hpp
# Opt level: O0

List<Variant> * __thiscall Variant::toList(Variant *this)

{
  Data *pDVar1;
  List<Variant> *other;
  List<Variant> *list;
  Data *newData;
  Variant *this_local;
  
  if ((this->data->type == listType) && (this->data->ref < 2)) {
    this_local = (Variant *)(this->data + 1);
  }
  else {
    pDVar1 = (Data *)operator_new__(0x70);
    this_local = (Variant *)(pDVar1 + 1);
    other = toList(this);
    List<Variant>::List((List<Variant> *)this_local,other);
    clear(this);
    this->data = pDVar1;
    this->data->type = listType;
    this->data->ref = 1;
  }
  return (List<Variant> *)this_local;
}

Assistant:

List<Variant>& toList()
  {
    if(data->type != listType || data->ref > 1)
    {
      Data* newData = (Data*)new char[sizeof(Data) + sizeof(List<Variant>)];
      List<Variant>* list = (List<Variant>*)(newData + 1);
      new (list) List<Variant>(((const Variant*)this)->toList());
      clear();
      data = newData;
      data->type = listType;
      data->ref = 1;
      return *list;
    }
    return *(List<Variant>*)(data + 1);
  }